

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvn.cpp
# Opt level: O1

int __thiscall ncnn::MVN::forward(MVN *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  int _w;
  int _h;
  uint _c;
  size_t sVar2;
  Allocator *pAVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  size_t sVar7;
  Allocator *pAVar8;
  void *pvVar9;
  long lVar10;
  int *piVar11;
  uint uVar12;
  ulong uVar13;
  void *pvVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  ulong uVar18;
  ulong uVar19;
  float fVar20;
  Mat sum;
  ulong local_78;
  int *piStack_70;
  
  _w = bottom_blob->w;
  _h = bottom_blob->h;
  _c = bottom_blob->c;
  uVar19 = (ulong)_c;
  sVar2 = bottom_blob->elemsize;
  Mat::create(top_blob,_w,_h,_c,sVar2,opt->blob_allocator);
  if (top_blob->data == (void *)0x0) {
    return -100;
  }
  if ((long)top_blob->c * top_blob->cstep == 0) {
    return -100;
  }
  lVar10 = (long)(int)_c;
  pAVar3 = opt->workspace_allocator;
  local_78 = 0;
  piStack_70 = (int *)0x0;
  if (_c != 0) {
    uVar18 = sVar2 * lVar10 + 3 & 0xfffffffffffffffc;
    if (pAVar3 == (Allocator *)0x0) {
      pvVar9 = malloc(uVar18 + 0x1c);
      local_78 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
      *(void **)(local_78 - 8) = pvVar9;
    }
    else {
      local_78 = (*(code *)**(undefined8 **)pAVar3)();
    }
    piStack_70 = (int *)(local_78 + uVar18);
    *(undefined4 *)(local_78 + uVar18) = 1;
  }
  iVar17 = -100;
  if ((local_78 == 0) || (lVar10 == 0)) goto LAB_00113578;
  uVar12 = _h * _w;
  uVar18 = (ulong)uVar12;
  if (0 < (int)_c) {
    pvVar9 = bottom_blob->data;
    sVar4 = bottom_blob->cstep;
    sVar5 = bottom_blob->elemsize;
    uVar13 = 0;
    do {
      fVar20 = 0.0;
      if (0 < (int)uVar12) {
        uVar15 = 0;
        do {
          fVar20 = fVar20 + *(float *)((long)pvVar9 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar18 != uVar15);
      }
      *(float *)(local_78 + uVar13 * 4) = fVar20;
      uVar13 = uVar13 + 1;
      pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar5);
    } while (uVar13 != uVar19);
  }
  if (this->across_channels == 0) {
    if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      pvVar14 = top_blob->data;
      sVar5 = top_blob->cstep;
      sVar6 = top_blob->elemsize;
      sVar7 = bottom_blob->elemsize;
      uVar13 = 0;
      do {
        if (0 < (int)uVar12) {
          fVar20 = *(float *)(local_78 + uVar13 * 4);
          uVar15 = 0;
          do {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar9 + uVar15 * 4) - fVar20 * (1.0 / (float)(int)uVar12);
            uVar15 = uVar15 + 1;
          } while (uVar18 != uVar15);
        }
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
        pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar7);
      } while (uVar13 != uVar19);
    }
  }
  else {
    fVar20 = 0.0;
    if (0 < (int)_c) {
      uVar13 = 0;
      do {
        fVar20 = fVar20 + *(float *)(local_78 + uVar13 * 4);
        uVar13 = uVar13 + 1;
      } while (uVar19 != uVar13);
    }
    if (0 < (int)_c) {
      pvVar9 = bottom_blob->data;
      sVar4 = bottom_blob->cstep;
      sVar5 = top_blob->cstep;
      sVar6 = top_blob->elemsize;
      pvVar14 = top_blob->data;
      sVar7 = bottom_blob->elemsize;
      uVar13 = 0;
      do {
        if (0 < (int)uVar12) {
          uVar15 = 0;
          do {
            *(float *)((long)pvVar14 + uVar15 * 4) =
                 *(float *)((long)pvVar9 + uVar15 * 4) - fVar20 / (float)(int)(_c * uVar12);
            uVar15 = uVar15 + 1;
          } while (uVar18 != uVar15);
        }
        uVar13 = uVar13 + 1;
        pvVar14 = (void *)((long)pvVar14 + sVar5 * sVar6);
        pvVar9 = (void *)((long)pvVar9 + sVar4 * sVar7);
      } while (uVar13 != uVar19);
    }
  }
  if (this->normalize_variance != 0) {
    pAVar8 = opt->workspace_allocator;
    if (_c == 0) {
      uVar13 = 0;
      piVar11 = (int *)0x0;
    }
    else {
      uVar15 = sVar2 * lVar10 + 3 & 0xfffffffffffffffc;
      if (pAVar8 == (Allocator *)0x0) {
        pvVar9 = malloc(uVar15 + 0x1c);
        uVar13 = (long)pvVar9 + 0x17U & 0xfffffffffffffff0;
        *(void **)(uVar13 - 8) = pvVar9;
      }
      else {
        uVar13 = (*(code *)**(undefined8 **)pAVar8)(pAVar8,uVar15 + 4);
      }
      piVar11 = (int *)(uVar13 + uVar15);
      *(undefined4 *)(uVar13 + uVar15) = 1;
    }
    iVar17 = -100;
    if (_c == 0 || uVar13 == 0) {
      if (piVar11 != (int *)0x0) {
        LOCK();
        *piVar11 = *piVar11 + -1;
        UNLOCK();
        if (*piVar11 == 0) {
          if (pAVar8 == (Allocator *)0x0) {
            if (uVar13 != 0) {
              free(*(void **)(uVar13 - 8));
              iVar17 = -100;
            }
          }
          else {
            (**(code **)(*(long *)pAVar8 + 8))(pAVar8,uVar13);
            iVar17 = -100;
          }
        }
      }
      goto LAB_00113578;
    }
    if (0 < (int)_c) {
      pvVar9 = top_blob->data;
      sVar2 = top_blob->cstep;
      sVar4 = top_blob->elemsize;
      uVar15 = 0;
      do {
        fVar20 = 0.0;
        if (0 < (int)uVar12) {
          uVar16 = 0;
          do {
            fVar1 = *(float *)((long)pvVar9 + uVar16 * 4);
            fVar20 = fVar20 + fVar1 * fVar1;
            uVar16 = uVar16 + 1;
          } while (uVar18 != uVar16);
        }
        *(float *)(uVar13 + uVar15 * 4) = fVar20;
        uVar15 = uVar15 + 1;
        pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar4);
      } while (uVar15 != uVar19);
    }
    if (this->across_channels == 0) {
      if (0 < (int)_c) {
        pvVar9 = top_blob->data;
        sVar2 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        uVar15 = 0;
        do {
          if (0 < (int)uVar12) {
            fVar20 = *(float *)(uVar13 + uVar15 * 4);
            fVar1 = this->eps;
            uVar16 = 0;
            do {
              *(float *)((long)pvVar9 + uVar16 * 4) =
                   *(float *)((long)pvVar9 + uVar16 * 4) *
                   (1.0 / (SQRT(fVar20 * (1.0 / (float)(int)uVar12)) + fVar1));
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          uVar15 = uVar15 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar4);
        } while (uVar15 != uVar19);
      }
    }
    else {
      fVar20 = 0.0;
      if (0 < (int)_c) {
        uVar15 = 0;
        do {
          fVar20 = fVar20 + *(float *)(uVar13 + uVar15 * 4);
          uVar15 = uVar15 + 1;
        } while (uVar19 != uVar15);
      }
      if (0 < (int)_c) {
        fVar1 = this->eps;
        sVar2 = top_blob->cstep;
        sVar4 = top_blob->elemsize;
        pvVar9 = top_blob->data;
        uVar15 = 0;
        do {
          if (0 < (int)uVar12) {
            uVar16 = 0;
            do {
              *(float *)((long)pvVar9 + uVar16 * 4) =
                   *(float *)((long)pvVar9 + uVar16 * 4) *
                   (1.0 / (SQRT(fVar20 / (float)(int)(_c * uVar12)) + fVar1));
              uVar16 = uVar16 + 1;
            } while (uVar18 != uVar16);
          }
          uVar15 = uVar15 + 1;
          pvVar9 = (void *)((long)pvVar9 + sVar2 * sVar4);
        } while (uVar15 != uVar19);
      }
    }
    if (piVar11 != (int *)0x0) {
      LOCK();
      *piVar11 = *piVar11 + -1;
      UNLOCK();
      if (*piVar11 == 0) {
        if (pAVar8 == (Allocator *)0x0) {
          if (uVar13 != 0) {
            free(*(void **)(uVar13 - 8));
          }
        }
        else {
          (**(code **)(*(long *)pAVar8 + 8))(pAVar8,uVar13);
        }
      }
    }
    iVar17 = -100;
    if (_c == 0 || uVar13 == 0) goto LAB_00113578;
  }
  iVar17 = 0;
LAB_00113578:
  if (piStack_70 != (int *)0x0) {
    LOCK();
    *piStack_70 = *piStack_70 + -1;
    UNLOCK();
    if (*piStack_70 == 0) {
      if (pAVar3 == (Allocator *)0x0) {
        if (local_78 != 0) {
          free(*(void **)(local_78 - 8));
        }
      }
      else {
        (**(code **)(*(long *)pAVar3 + 8))();
      }
    }
  }
  return iVar17;
}

Assistant:

int MVN::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int channels = bottom_blob.c;
    size_t elemsize = bottom_blob.elemsize;
    int size = w * h;

    top_blob.create(w, h, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // prepare sum per channel
    Mat sum(channels, elemsize, opt.workspace_allocator);
    if (sum.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q=0; q<channels; q++)
    {
        const float* ptr = bottom_blob.channel(q);

        float s = 0.f;
        for (int i=0; i<size; i++)
        {
            s += ptr[i];
        }

        sum[q] = s;
    }

    if (across_channels)
    {
        // compute mean across channels
        float mean = 0.f;
        for (int q=0; q<channels; q++)
        {
            mean += sum[q];
        }
        mean = mean / (channels * size);

        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }
    else
    {
        // subtract mean
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);
            float mean = sum[q] / size;

            for (int i=0; i<size; i++)
            {
                outptr[i] = ptr[i] - mean;
            }
        }
    }

    if (normalize_variance)
    {
        // prepare squared sum per channel
        Mat sqsum(channels, elemsize, opt.workspace_allocator);
        if (sqsum.empty())
            return -100;

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q=0; q<channels; q++)
        {
            const float* ptr = top_blob.channel(q);

            float s = 0.f;
            for (int i=0; i<size; i++)
            {
                s += ptr[i] * ptr[i];
            }

            sqsum[q] = s;
        }

        if (across_channels)
        {
            // compute squared mean across channels
            float sqmean = 0.f;
            for (int q=0; q<channels; q++)
            {
                sqmean += sqsum[q];
            }
            sqmean = sqmean / (channels * size);

            // normalize variance
            float norm_var = sqrt(sqmean) + eps;
            float norm_var_inv = 1.f / norm_var;

            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }
        else
        {
            // apply normalize_variance
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q=0; q<channels; q++)
            {
                float* outptr = top_blob.channel(q);
                float sqmean = sqsum[q] / size;
                float norm_var = sqrt(sqmean) + eps;
                float norm_var_inv = 1.f / norm_var;

                for (int i=0; i<size; i++)
                {
                    outptr[i] = outptr[i] * norm_var_inv;
                }
            }
        }

    }

    return 0;
}